

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme-test.cc
# Opt level: O2

void scope_example2::Execute(void)

{
  thread worker;
  MyLogger capture_messages;
  thread local_a0;
  function<void_()> local_98;
  Logger local_78;
  
  f();
  std::function<void_()>::operator()((function<void_()> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  g();
  std::function<void_()>::operator()((function<void_()> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  h();
  std::function<void_()>::operator()((function<void_()> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  Logger::Logger(&local_78);
  g();
  std::thread::thread<std::function<void()>,,void>(&local_a0,&local_98);
  std::_Function_base::~_Function_base(&local_98.super__Function_base);
  std::thread::join();
  std::thread::~thread(&local_a0);
  Logger::~Logger(&local_78);
  return;
}

Assistant:

void Execute() {
  f()();  // Fine.
  g()();  // Fine.
  h()();  // SIGSEGV!

  // Fine. g captures capture_messages, but capture_messages doesn't go out of
  // scope until the worker thread is joined.
  MyLogger capture_messages;
  std::thread worker(g());
  worker.join();
}